

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

int __thiscall boost::filesystem::detail::remove(detail *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  err_t error_num;
  error_code tmp_ec;
  error_code local_40;
  file_type local_30 [2];
  
  iVar2 = 0;
  local_40.m_val = 0;
  local_40.m_cat = system::system_category();
  symlink_status((detail *)local_30,(path *)this,&local_40);
  error_num = 0;
  if (local_30[0] == status_error) {
    error_num = local_40.m_val;
  }
  bVar1 = anon_unknown.dwarf_59d9::error
                    (error_num,(path *)this,(error_code *)__filename,"boost::filesystem::remove");
  if (!bVar1) {
    bVar1 = anon_unknown.dwarf_59d9::remove_file_or_directory
                      ((path *)this,local_30[0],(error_code *)__filename);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  return iVar2;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool remove(const path& p, error_code* ec)
  {
    error_code tmp_ec;
    file_type type = query_file_type(p, &tmp_ec);
    if (error(type == status_error ? tmp_ec.value() : 0, p, ec,
        "boost::filesystem::remove"))
      return false;

    // Since POSIX remove() is specified to work with either files or directories, in a
    // perfect world it could just be called. But some important real-world operating
    // systems (Windows, Mac OS X, for example) don't implement the POSIX spec. So
    // remove_file_or_directory() is always called to keep it simple.
    return remove_file_or_directory(p, type, ec);
  }